

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-naming.h
# Opt level: O0

void wabt::RenameToIdentifier
               (string *name,Index i,BindingHash *bh,
               set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
               *filter)

{
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  size_type sVar8;
  Binding local_108;
  string local_e0;
  undefined8 local_c0;
  size_type base_len;
  undefined8 uStack_b0;
  Index disambiguator;
  size_t max_identifier_length;
  _Self local_a0;
  undefined1 local_98 [8];
  string_view word;
  size_type word_end;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_78;
  char c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  size_t word_start;
  size_t read;
  size_t nesting;
  string s;
  set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
  *filter_local;
  BindingHash *bh_local;
  Index i_local;
  string *name_local;
  
  s.field_2._8_8_ = filter;
  std::__cxx11::string::string((string *)&nesting);
  read = 0;
  word_start = 0;
  __range1 = (string *)0x0;
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_78._M_current = (char *)std::__cxx11::string::end();
  do {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff88);
    if (!bVar1) {
      uVar6 = std::__cxx11::string::empty();
      if (((uVar6 & 1) == 0) && (pcVar7 = (char *)std::__cxx11::string::back(), *pcVar7 == '_')) {
        std::__cxx11::string::pop_back();
      }
      uStack_b0 = 100;
      uVar6 = std::__cxx11::string::size();
      if (100 < uVar6) {
        std::__cxx11::string::resize((ulong)&nesting);
      }
      std::
      unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
      ::erase(&bh->
               super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
              ,name);
      base_len._4_4_ = 0;
      local_c0 = std::__cxx11::string::size();
      while (sVar8 = std::
                     unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                     ::count(&bh->
                              super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                             ,(key_type *)&nesting), sVar8 != 0) {
        base_len._4_4_ = base_len._4_4_ + 1;
        std::__cxx11::string::resize((ulong)&nesting);
        std::__cxx11::string::operator+=((string *)&nesting,'_');
        std::__cxx11::to_string(&local_e0,base_len._4_4_);
        std::__cxx11::string::operator+=((string *)&nesting,(string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
      }
      std::__cxx11::string::operator=((string *)name,(string *)&nesting);
      Binding::Binding(&local_108,i);
      std::
      unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
      ::emplace<std::__cxx11::string&,wabt::Binding>
                ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                  *)bh,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nesting
                 ,&local_108);
      std::__cxx11::string::~string((string *)&nesting);
      return;
    }
    pbVar3 = (byte *)__gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end1);
    word_end._7_1_ = *pbVar3;
    word_start = word_start + 1;
    if (word_end._7_1_ == 0x28) {
      read = read + 1;
    }
    if (word_end._7_1_ == 0x29) {
      read = read - 1;
    }
    if (read == 0) {
      iVar2 = isalnum((uint)word_end._7_1_);
      if (iVar2 == 0) {
        word_end._7_1_ = 0x5f;
      }
      if ((((word_end._7_1_ != 0x5f) ||
           ((uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0 &&
            (pcVar7 = (char *)std::__cxx11::string::back(), *pcVar7 != '_')))) &&
          (std::__cxx11::string::operator+=((string *)&nesting,word_end._7_1_), s.field_2._8_8_ != 0
          )) && ((word_end._7_1_ == 0x5f ||
                 (sVar4 = std::__cxx11::string::size(), word_start == sVar4)))) {
        word.size_ = std::__cxx11::string::size();
        if (word_end._7_1_ == 0x5f) {
          word.size_ = word.size_ - 1;
        }
        if (word.size_ <= __range1) {
          __assert_fail("word_end > word_start",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/decompiler-naming.h"
                        ,0x44,
                        "void wabt::RenameToIdentifier(std::string &, Index, BindingHash &, const std::set<string_view> *)"
                       );
        }
        lVar5 = std::__cxx11::string::c_str();
        string_view::string_view
                  ((string_view *)local_98,(char *)(&__range1->_M_dataplus + lVar5),
                   word.size_ - (long)__range1);
        local_a0._M_node =
             (_Base_ptr)
             std::
             set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
             ::find((set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
                     *)s.field_2._8_8_,(key_type *)local_98);
        max_identifier_length =
             (size_t)std::
                     set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
                     ::end((set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
                            *)s.field_2._8_8_);
        bVar1 = std::operator!=(&local_a0,(_Self *)&max_identifier_length);
        if (bVar1) {
          std::__cxx11::string::resize((ulong)&nesting);
        }
        __range1 = (string *)std::__cxx11::string::size();
      }
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

inline void RenameToIdentifier(std::string& name, Index i,
                               BindingHash& bh,
                               const std::set<string_view>* filter) {
  // Filter out non-identifier characters, and try to reduce the size of
  // gigantic C++ signature names.
  std::string s;
  size_t nesting = 0;
  size_t read = 0;
  size_t word_start = 0;
  for (auto c : name) {
    read++;
    // We most certainly don't want to parse the entirety of C++ signatures,
    // but these names are sometimes several lines long, so would be great
    // to trim down. One quick way to do that is to remove anything between
    // nested (), which usually means the parameter list.
    if (c == '(') {
      nesting++;
    }
    if (c == ')') {
      nesting--;
    }
    if (nesting) {
      continue;
    }
    if (!isalnum(static_cast<unsigned char>(c))) {
      c = '_';
    }
    if (c == '_') {
      if (s.empty()) {
        continue;  // Skip leading.
      }
      if (s.back() == '_') {
        continue;  // Consecutive.
      }
    }
    s += c;
    if (filter && (c == '_' || read == name.size())) {
      // We found a "word" inside a snake_case identifier.
      auto word_end = s.size();
      if (c == '_') {
        word_end--;
      }
      assert(word_end > word_start);
      auto word = string_view(s.c_str() + word_start, word_end - word_start);
      if (filter->find(word) != filter->end()) {
        s.resize(word_start);
      }
      word_start = s.size();
    }
  }
  if (!s.empty() && s.back() == '_') {
    s.pop_back();  // Trailing.
  }
  // If after all this culling, we're still gigantic (STL identifier can
  // easily be hundreds of chars in size), just cut the identifier
  // down, it will be disambiguated below, if needed.
  const size_t max_identifier_length = 100;
  if (s.size() > max_identifier_length) {
    s.resize(max_identifier_length);
  }
  // Remove original binding first, such that it doesn't match with our
  // new name.
  bh.erase(name);
  // Find a unique name.
  Index disambiguator = 0;
  auto base_len = s.size();
  for (;;) {
    if (bh.count(s) == 0) {
      break;
    }
    disambiguator++;
    s.resize(base_len);
    s += '_';
    s += std::to_string(disambiguator);
  }
  // Replace name in bindings.
  name = s;
  bh.emplace(s, Binding(i));
}